

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O0

void __thiscall gl4cts::PostDepthSampleMaskCase::deinit(PostDepthSampleMaskCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  PostDepthSampleMaskCase *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(0x8d40,0);
  if (this->m_framebufferMS != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_framebufferMS);
  }
  if (this->m_framebuffer != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_framebuffer);
  }
  if (this->m_textureMS != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_textureMS);
  }
  if (this->m_texture != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture);
  }
  if (this->m_depthStencilRenderbuffer != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_depthStencilRenderbuffer);
  }
  return;
}

Assistant:

void PostDepthSampleMaskCase::deinit()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

	if (m_framebufferMS)
		gl.deleteFramebuffers(1, &m_framebufferMS);
	if (m_framebuffer)
		gl.deleteFramebuffers(1, &m_framebuffer);

	if (m_textureMS)
		gl.deleteTextures(1, &m_textureMS);
	if (m_texture)
		gl.deleteTextures(1, &m_texture);

	if (m_depthStencilRenderbuffer)
		gl.deleteRenderbuffers(1, &m_depthStencilRenderbuffer);
}